

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtPubkeyListBip32Data
              (void *handle,void *pubkey_list_handle,uint32_t index,char **pubkey,char **fingerprint
              ,char **bip32_path)

{
  undefined8 uVar1;
  size_type sVar2;
  undefined8 *in_RCX;
  uint in_EDX;
  long in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  value_type key;
  CfdCapiPsbtPubkeyListHandle *list_handle;
  char *work_path;
  char *work_fingerprint;
  char *work_pubkey;
  int result;
  size_type in_stack_fffffffffffffb58;
  KeyData *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffb80;
  KeyData *in_stack_fffffffffffffb98;
  allocator *paVar3;
  KeyData *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffbc0;
  string local_408;
  ByteData local_3e8;
  string local_3d0;
  Pubkey local_3b0;
  string *in_stack_fffffffffffffc68;
  void *in_stack_fffffffffffffc70;
  ExtPubkey local_378;
  string local_308;
  KeyData local_2e8;
  undefined1 local_192;
  allocator local_191;
  string local_190 [32];
  CfdSourceLocation local_170;
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  CfdSourceLocation local_130;
  undefined1 local_112;
  allocator local_111;
  string local_110 [32];
  CfdSourceLocation local_f0;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  CfdSourceLocation local_b0;
  long local_98;
  allocator local_89;
  string local_88 [48];
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  uint local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"PsbtPubkeyList",&local_89);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_98 = local_18;
  if (local_28 == (undefined8 *)0x0) {
    local_b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_b0.filename = local_b0.filename + 1;
    local_b0.line = 0x763;
    local_b0.funcname = "CfdGetPsbtPubkeyListBip32Data";
    cfd::core::logger::warn<>(&local_b0,"pubkey is null.");
    local_d2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Failed to parameter. pubkey is null.",&local_d1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb80,error_code,in_stack_fffffffffffffb70);
    local_d2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_18 + 0x18) == 0) {
    local_f0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_f0.filename = local_f0.filename + 1;
    local_f0.line = 0x769;
    local_f0.funcname = "CfdGetPsbtPubkeyListBip32Data";
    cfd::core::logger::warn<>(&local_f0,"key_list is null.");
    local_112 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    paVar3 = &local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Failed to handle statement. key_list is null.",paVar3);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb80,error_code,in_stack_fffffffffffffb70);
    local_112 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  sVar2 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::size
                    (*(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> **)
                      (local_18 + 0x18));
  if (sVar2 <= local_1c) {
    local_130.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_130.filename = local_130.filename + 1;
    local_130.line = 0x76f;
    local_130.funcname = "CfdGetPsbtPubkeyListBip32Data";
    cfd::core::logger::warn<>(&local_130,"out of range error.");
    local_152 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"Failed to out of range.",&local_151);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb80,error_code,in_stack_fffffffffffffb70);
    local_152 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((*(byte *)(local_98 + 0x10) & 1) == 0) {
    local_170.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_170.filename = local_170.filename + 1;
    local_170.line = 0x774;
    local_170.funcname = "CfdGetPsbtPubkeyListBip32Data";
    cfd::core::logger::warn<>(&local_170,"bip32 not support error.");
    local_192 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    paVar3 = &local_191;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"Failed to bip32 not support.",paVar3);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb80,error_code,in_stack_fffffffffffffb70);
    local_192 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::at
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  cfd::core::KeyData::KeyData(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  if ((*(byte *)(local_98 + 0x11) & 1) == 0) {
    cfd::core::KeyData::GetPubkey(&local_3b0,&local_2e8);
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffc68,&local_3b0);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc68);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x5fb788);
  }
  else {
    cfd::core::KeyData::GetExtPubkey(&local_378,&local_2e8);
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_308,&local_378);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string((string *)&local_308);
    cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffb60);
  }
  if (local_30 != (undefined8 *)0x0) {
    cfd::core::KeyData::GetFingerprint(&local_3e8,&local_2e8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_3d0,&local_3e8);
    local_50 = cfd::capi::CreateString(in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string((string *)&local_3d0);
    cfd::core::ByteData::~ByteData((ByteData *)0x5fb84b);
  }
  if (local_38 != (undefined8 *)0x0) {
    cfd::core::KeyData::GetBip32Path_abi_cxx11_(&local_408,&local_2e8,kApostrophe,false);
    local_58 = cfd::capi::CreateString(in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string((string *)&local_408);
  }
  *local_28 = local_48;
  if (local_30 != (undefined8 *)0x0) {
    *local_30 = local_50;
  }
  if (local_38 != (undefined8 *)0x0) {
    *local_38 = local_58;
  }
  local_4 = 0;
  cfd::core::KeyData::~KeyData(in_stack_fffffffffffffb60);
  return local_4;
}

Assistant:

int CfdGetPsbtPubkeyListBip32Data(
    void* handle, void* pubkey_list_handle, uint32_t index, char** pubkey,
    char** fingerprint, char** bip32_path) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_pubkey = nullptr;
  char* work_fingerprint = nullptr;
  char* work_path = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(pubkey_list_handle, kPrefixPsbtPubkeyList);
    CfdCapiPsbtPubkeyListHandle* list_handle =
        static_cast<CfdCapiPsbtPubkeyListHandle*>(pubkey_list_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (list_handle->key_list == nullptr) {
      warn(CFD_LOG_SOURCE, "key_list is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. key_list is null.");
    }
    if (index >= list_handle->key_list->size()) {
      warn(CFD_LOG_SOURCE, "out of range error.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "Failed to out of range.");
    }
    if (!list_handle->has_bip32_list) {
      warn(CFD_LOG_SOURCE, "bip32 not support error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Failed to bip32 not support.");
    }

    auto key = list_handle->key_list->at(index);
    if (list_handle->has_xpub_list) {
      work_pubkey = CreateString(key.GetExtPubkey().ToString());
    } else {
      work_pubkey = CreateString(key.GetPubkey().GetHex());
    }
    if (fingerprint != nullptr) {
      work_fingerprint = CreateString(key.GetFingerprint().GetHex());
    }
    if (bip32_path != nullptr) work_path = CreateString(key.GetBip32Path());

    *pubkey = work_pubkey;
    if (fingerprint != nullptr) *fingerprint = work_fingerprint;
    if (bip32_path != nullptr) *bip32_path = work_path;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_pubkey, &work_fingerprint, &work_path);
  return result;
}